

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp.cc
# Opt level: O0

Regexp * re2::Regexp::HaveMatch(int match_id,ParseFlags flags)

{
  Regexp *this;
  Regexp *re;
  ParseFlags flags_local;
  int match_id_local;
  
  this = (Regexp *)operator_new(0x28);
  Regexp(this,kMaxRegexpOp,flags);
  (this->field_7).field_0.max_ = match_id;
  return this;
}

Assistant:

Regexp* Regexp::HaveMatch(int match_id, ParseFlags flags) {
  Regexp* re = new Regexp(kRegexpHaveMatch, flags);
  re->match_id_ = match_id;
  return re;
}